

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O1

void Assimp::SceneCombiner::Copy(aiBone **_dest,aiBone *src)

{
  ulong __n;
  uint uVar1;
  aiVertexWeight *__src;
  aiBone *__dest;
  aiVertexWeight *__s;
  
  if (src != (aiBone *)0x0 && _dest != (aiBone **)0x0) {
    __dest = (aiBone *)operator_new(0x450);
    (__dest->mName).length = 0;
    (__dest->mName).data[0] = '\0';
    memset((__dest->mName).data + 1,0x1b,0x3ff);
    __dest->mNumWeights = 0;
    __dest->mWeights = (aiVertexWeight *)0x0;
    (__dest->mOffsetMatrix).a1 = 1.0;
    (__dest->mOffsetMatrix).a2 = 0.0;
    (__dest->mOffsetMatrix).a3 = 0.0;
    (__dest->mOffsetMatrix).a4 = 0.0;
    (__dest->mOffsetMatrix).b1 = 0.0;
    (__dest->mOffsetMatrix).b2 = 1.0;
    (__dest->mOffsetMatrix).b3 = 0.0;
    (__dest->mOffsetMatrix).b4 = 0.0;
    (__dest->mOffsetMatrix).c1 = 0.0;
    (__dest->mOffsetMatrix).c2 = 0.0;
    (__dest->mOffsetMatrix).c3 = 1.0;
    (__dest->mOffsetMatrix).c4 = 0.0;
    (__dest->mOffsetMatrix).d1 = 0.0;
    (__dest->mOffsetMatrix).d2 = 0.0;
    (__dest->mOffsetMatrix).d3 = 0.0;
    (__dest->mOffsetMatrix).d4 = 1.0;
    *_dest = __dest;
    memcpy(__dest,src,0x450);
    __src = __dest->mWeights;
    if (__src != (aiVertexWeight *)0x0) {
      uVar1 = __dest->mNumWeights;
      __n = (ulong)uVar1 * 8;
      __s = (aiVertexWeight *)operator_new__(__n);
      if ((ulong)uVar1 != 0) {
        memset(__s,0,__n);
      }
      __dest->mWeights = __s;
      memcpy(__s,__src,__n);
      return;
    }
  }
  return;
}

Assistant:

void SceneCombiner::Copy(aiBone** _dest, const aiBone* src) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    aiBone* dest = *_dest = new aiBone();

    // get a flat copy
    ::memcpy(dest,src,sizeof(aiBone));

    // and reallocate all arrays
    GetArrayCopy( dest->mWeights, dest->mNumWeights );
}